

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O0

void ncnn::conv1x1s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias)

{
  float fVar1;
  float *pfVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  int i_1;
  float *r0_1;
  float k0_1;
  float *kernel0_1;
  float *img0_1;
  float *outptr_1;
  float sum3;
  float sum2;
  float sum1;
  float sum;
  int remain;
  int i;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float k3;
  float k2;
  float k1;
  float k0;
  float *kernel0;
  float *img3;
  float *img2;
  float *img1;
  float *img0;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float *in_stack_fffffffffffffd80;
  Mat *in_stack_fffffffffffffd88;
  Mat *in_stack_fffffffffffffd90;
  float local_238;
  int local_230;
  int local_22c;
  float *local_228;
  Mat local_210;
  float *local_1e0;
  float *local_1d8;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  int local_1c0;
  int local_1bc;
  Mat *local_1b8;
  float *local_1b0;
  float *local_1a8;
  float *local_1a0;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float *local_188;
  Mat local_180;
  Mat *local_150;
  Mat local_148;
  float *local_118;
  Mat local_110;
  float *local_e0;
  Mat local_d8;
  float *local_a8;
  float *local_90;
  int local_88;
  float local_84;
  Mat local_80;
  int local_4c;
  float *local_48;
  float *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_20;
  
  local_24 = *(int *)(in_RDI + 0x1c);
  local_28 = *(int *)(in_RDI + 0x24);
  local_2c = *(int *)(in_RSI + 0x1c);
  local_30 = *(int *)(in_RSI + 0x20);
  local_34 = *(int *)(in_RSI + 0x24);
  local_38 = local_24 * 2 + local_2c * -2;
  local_20 = in_RCX;
  local_40 = Mat::operator_cast_to_float_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(local_20);
  for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
    Mat::channel(in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
    if (local_48 == (float *)0x0) {
      local_238 = 0.0;
    }
    else {
      local_238 = local_48[local_4c];
    }
    local_84 = local_238;
    Mat::fill(in_stack_fffffffffffffd90,(float)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    for (local_88 = 0; local_88 + 3 < local_28; local_88 = local_88 + 4) {
      local_90 = Mat::operator_cast_to_float_(&local_80);
      Mat::channel(in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_d8);
      Mat::~Mat((Mat *)0x112da0);
      local_a8 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_110);
      Mat::~Mat((Mat *)0x112dee);
      local_e0 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      in_stack_fffffffffffffd90 = &local_148;
      pfVar2 = Mat::operator_cast_to_float_(in_stack_fffffffffffffd90);
      Mat::~Mat((Mat *)0x112e3d);
      local_118 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      in_stack_fffffffffffffd88 = (Mat *)Mat::operator_cast_to_float_(&local_180);
      Mat::~Mat((Mat *)0x112e8a);
      local_188 = local_40 + (long)(local_4c * local_28) + (long)local_88;
      local_18c = *local_188;
      local_190 = local_188[1];
      local_194 = local_188[2];
      local_198 = local_188[3];
      local_1a0 = local_a8;
      local_1a8 = local_e0;
      local_1b0 = local_118;
      local_1b8 = in_stack_fffffffffffffd88;
      for (local_1bc = 0; local_1bc < local_30; local_1bc = local_1bc + 1) {
        for (local_1c0 = local_2c; 0 < local_1c0; local_1c0 = local_1c0 + -1) {
          local_1c4 = *local_1a0 * local_18c;
          local_1c8 = *local_1a8 * local_190;
          local_1cc = *local_1b0 * local_194;
          local_1d0 = *(float *)&local_1b8->data * local_198;
          *local_90 = local_1c4 + local_1c8 + local_1cc + local_1d0 + *local_90;
          local_1a0 = local_1a0 + 2;
          local_1a8 = local_1a8 + 2;
          local_1b0 = local_1b0 + 2;
          local_1b8 = (Mat *)&local_1b8->refcount;
          local_90 = local_90 + 1;
        }
        local_1a0 = local_1a0 + local_38;
        local_1a8 = local_1a8 + local_38;
        local_1b0 = local_1b0 + local_38;
        local_1b8 = (Mat *)((long)&local_1b8->data + (long)local_38 * 4);
      }
      local_150 = in_stack_fffffffffffffd88;
    }
    for (; local_88 < local_28; local_88 = local_88 + 1) {
      in_stack_fffffffffffffd80 = Mat::operator_cast_to_float_(&local_80);
      local_1d8 = in_stack_fffffffffffffd80;
      Mat::channel(in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_210);
      Mat::~Mat((Mat *)0x113209);
      fVar1 = local_40[(long)(local_4c * local_28) + (long)local_88];
      local_228 = pfVar2;
      for (local_22c = 0; local_22c < local_30; local_22c = local_22c + 1) {
        for (local_230 = local_2c; 0 < local_230; local_230 = local_230 + -1) {
          *local_1d8 = *local_228 * fVar1 + *local_1d8;
          local_228 = local_228 + 2;
          local_1d8 = local_1d8 + 1;
        }
        local_228 = local_228 + local_38;
      }
      local_1e0 = pfVar2;
    }
    Mat::~Mat((Mat *)0x11333b);
  }
  return;
}

Assistant:

static void conv1x1s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;
                    float sum1 = *r1 * k1;
                    float sum2 = *r2 * k2;
                    float sum3 = *r3 * k3;

                    *outptr += sum + sum1 + sum2 + sum3;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;

                    *outptr += sum;

                    r0 += 2;
                    outptr++;
                }

                r0 += tailstep;
            }

        }
    }

}